

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

ssize_t recvfrom(int __fd,void *__buf,size_t __n,int __flags,sockaddr *__addr,socklen_t *__addr_len)

{
  rpchook_t *prVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ssize_t sVar4;
  int *piVar5;
  pollfd local_38;
  
  if (g_sys_recvfrom_func == (recvfrom_pfn_t)0x0) {
    g_sys_recvfrom_func = (recvfrom_pfn_t)dlsym(0xffffffffffffffff,"recvfrom");
  }
  bVar3 = co_is_enable_sys_hook();
  if ((((bVar3) && ((uint)__fd < 1000000)) &&
      (prVar1 = g_rpchook_socket_fd[(uint)__fd], prVar1 != (rpchook_t *)0x0)) &&
     ((prVar1->user_flag & 0x800) == 0)) {
    auVar2 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar1->read_timeout).tv_usec);
    local_38.events = 0x19;
    local_38.revents = 0;
    local_38.fd = __fd;
    poll(&local_38,1,
         ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) +
         (int)(prVar1->read_timeout).tv_sec * 1000);
    sVar4 = (*g_sys_recvfrom_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
    if (sVar4 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 == 0xb) {
        *piVar5 = 0x7c5;
      }
    }
    return sVar4;
  }
  sVar4 = (*g_sys_recvfrom_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
  return sVar4;
}

Assistant:

ssize_t recvfrom(int socket, void *buffer, size_t length,
	                 int flags, struct sockaddr *address,
					               socklen_t *address_len)
{
	HOOK_SYS_FUNC( recvfrom );
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_recvfrom_func( socket,buffer,length,flags,address,address_len );
	}

	rpchook_t *lp = get_by_fd( socket );
	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_recvfrom_func( socket,buffer,length,flags,address,address_len );
	}

	int timeout = ( lp->read_timeout.tv_sec * 1000 ) 
				+ ( lp->read_timeout.tv_usec / 1000 );


	struct pollfd pf = { 0 };
	pf.fd = socket;
	pf.events = ( POLLIN | POLLERR | POLLHUP );
	poll( &pf,1,timeout );

	ssize_t ret = g_sys_recvfrom_func( socket,buffer,length,flags,address,address_len );
	if(ret<0 && errno == EAGAIN){
		//timeout from co_routine_poll, errno set to indicate special value
		errno = LIBCO_POLL_TIMEOUT;
	}
	return ret;
}